

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ExtractChannel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t channelId)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  imageException *this;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar *puVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  bVar1 = in->_colorCount;
  if (channelId < bVar1) {
    uVar2 = out->_rowSize;
    if (height * uVar2 != 0) {
      puVar4 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar2);
      puVar5 = puVar4 + height * uVar2;
      uVar3 = in->_rowSize;
      puVar6 = in->_data + (ulong)channelId + (ulong)(startXIn * bVar1) + (ulong)(startYIn * uVar3);
      do {
        if (width != 0) {
          uVar7 = 0;
          puVar8 = puVar6;
          do {
            puVar4[uVar7] = *puVar8;
            puVar8 = puVar8 + (uint)bVar1;
            uVar7 = uVar7 + 1;
          } while (width != uVar7);
        }
        puVar4 = puVar4 + uVar2;
        puVar6 = puVar6 + uVar3;
      } while (puVar4 != puVar5);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this,"Channel ID for color image is greater than channel count in input image");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ExtractChannel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut,
                         uint32_t startYOut, uint32_t width, uint32_t height, uint8_t channelId )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( channelId >= in.colorCount() )
            throw imageException( "Channel ID for color image is greater than channel count in input image" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount + channelId;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = *(inX);
        }
    }